

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

uint32_t helper_absdif_b(CPUTriCoreState *env,target_ulong_conflict r1,target_ulong_conflict r2)

{
  uint uVar1;
  int32_t iVar2;
  int32_t iVar3;
  uint uVar4;
  uint uVar5;
  int start;
  uint uVar6;
  uint uVar7;
  
  uVar7 = 0;
  uVar6 = 0;
  uVar5 = 0;
  for (start = 0; start != 0x20; start = start + 8) {
    iVar2 = sextract32(r2,start,8);
    iVar3 = sextract32(r1,start,8);
    uVar4 = iVar3 - iVar2;
    uVar1 = -uVar4;
    if (0 < (int)uVar4) {
      uVar1 = uVar4;
    }
    uVar7 = uVar7 | (int)(char)uVar1 != uVar1;
    uVar6 = uVar6 | uVar1 * 2 ^ uVar1;
    uVar5 = uVar5 | (uVar1 & 0xff) << ((byte)start & 0x1f);
  }
  env->PSW_USB_V = uVar7 << 0x1f;
  env->PSW_USB_SV = env->PSW_USB_SV | uVar7 << 0x1f;
  env->PSW_USB_AV = uVar6 << 0x18;
  env->PSW_USB_SAV = env->PSW_USB_SAV | uVar6 << 0x18;
  return uVar5;
}

Assistant:

uint32_t helper_absdif_b(CPUTriCoreState *env, target_ulong r1, target_ulong r2)
{
    int32_t b, i;
    int32_t extr_r2;
    int32_t ovf = 0;
    int32_t avf = 0;
    int32_t ret = 0;

    for (i = 0; i < 4; i++) {
        extr_r2 = sextract32(r2, i * 8, 8);
        b = sextract32(r1, i * 8, 8);
        b = (b > extr_r2) ? (b - extr_r2) : (extr_r2 - b);
        ovf |= (b > 0x7F) || (b < -0x80);
        avf |= b ^ b * 2u;
        ret |= (b & 0xff) << (i * 8);
    }

    env->PSW_USB_V = ovf << 31;
    env->PSW_USB_SV |= env->PSW_USB_V;
    env->PSW_USB_AV = avf << 24;
    env->PSW_USB_SAV |= env->PSW_USB_AV;
    return ret;
}